

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O0

void pybind11::detail::erase_all(string *string,string *search)

{
  ulong uVar1;
  size_t pos;
  string *search_local;
  string *string_local;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)string,(ulong)search);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::length();
    std::__cxx11::string::erase((ulong)string,uVar1);
  }
  return;
}

Assistant:

inline void erase_all(std::string &string, const std::string &search) {
    for (size_t pos = 0;;) {
        pos = string.find(search, pos);
        if (pos == std::string::npos) {
            break;
        }
        string.erase(pos, search.length());
    }
}